

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functional.h
# Opt level: O0

bool __thiscall
pybind11::detail::type_caster<std::function<void_(kratos::Generator_*)>,_void>::load
          (type_caster<std::function<void_(kratos::Generator_*)>,_void> *this,handle src,
          bool convert)

{
  bool bVar1;
  PyObject **ppPVar2;
  PyTypeObject *local_b8;
  func_handle local_98;
  func_wrapper local_90;
  int local_84;
  function_record *local_80;
  function_record *rec;
  capsule local_70;
  capsule c;
  PyObject *cfunc_self;
  handle local_48;
  handle cfunc;
  function local_38;
  function func;
  bool convert_local;
  type_caster<std::function<void_(kratos::Generator_*)>,_void> *this_local;
  handle src_local;
  
  this_local = (type_caster<std::function<void_(kratos::Generator_*)>,_void> *)src.m_ptr;
  bVar1 = object_api<pybind11::handle>::is_none((object_api<pybind11::handle> *)&this_local);
  if (bVar1) {
    if (convert) {
      src_local.m_ptr._7_1_ = 1;
    }
    else {
      src_local.m_ptr._7_1_ = 0;
    }
    goto LAB_00726f9d;
  }
  func.super_object.super_handle.m_ptr = (object)(object)this_local;
  bVar1 = isinstance<pybind11::function,_0>((handle)this_local);
  if (!bVar1) {
    src_local.m_ptr._7_1_ = 0;
    goto LAB_00726f9d;
  }
  cfunc.m_ptr = (PyObject *)this_local;
  reinterpret_borrow<pybind11::function>((pybind11 *)&local_38,(handle)this_local);
  local_48 = pybind11::function::cpp_function(&local_38);
  bVar1 = pybind11::handle::operator_cast_to_bool(&local_48);
  if (bVar1) {
    ppPVar2 = pybind11::handle::ptr(&local_48);
    if ((*(uint *)((*ppPVar2)[1].ob_refcnt + 0x10) & 0x20) == 0) {
      ppPVar2 = pybind11::handle::ptr(&local_48);
      local_b8 = (*ppPVar2)[1].ob_type;
    }
    else {
      local_b8 = (PyTypeObject *)0x0;
    }
    pybind11::handle::handle((handle *)&c,(PyObject *)local_b8);
    bVar1 = isinstance<pybind11::capsule,_0>((handle)c.super_object.super_handle.m_ptr);
    if (!bVar1) goto LAB_00726ef6;
    pybind11::handle::handle((handle *)&rec,(PyObject *)local_b8);
    reinterpret_borrow<pybind11::capsule>((pybind11 *)&local_70,(handle)rec);
    for (local_80 = capsule::operator_cast_to_function_record_(&local_70);
        local_80 != (function_record *)0x0; local_80 = local_80->next) {
      if (((*(ushort *)&local_80->field_0x59 >> 2 & 1) != 0) &&
         (bVar1 = same_type((type_info *)&(*)(kratos::Generator*)::typeinfo,
                            (type_info *)local_80->data[1]), bVar1)) {
        std::function<void(kratos::Generator*)>::operator=
                  ((function<void(kratos::Generator*)> *)this,
                   (_func_void_Generator_ptr **)local_80->data);
        src_local.m_ptr._7_1_ = 1;
        local_84 = 1;
        goto LAB_00726edc;
      }
    }
    local_84 = 0;
LAB_00726edc:
    capsule::~capsule(&local_70);
    if (local_84 == 0) goto LAB_00726ef6;
  }
  else {
LAB_00726ef6:
    type_caster<std::function<void(kratos::Generator*)>,void>::load(pybind11::handle,bool)::
    func_handle::func_handle(pybind11::function___(&local_98,&local_38);
    type_caster<std::function<void(kratos::Generator*)>,void>::load(pybind11::handle,bool)::
    func_wrapper::func_wrapper(pybind11::detail::type_caster<std::function<void(kratos::
    Generator*)>,void>::load(pybind11::handle,bool)::func_handle___(&local_90,&local_98);
    std::function<void(kratos::Generator*)>::operator=
              ((function<void(kratos::Generator*)> *)this,&local_90);
    load::func_wrapper::~func_wrapper(&local_90);
    load::func_handle::~func_handle(&local_98);
    src_local.m_ptr._7_1_ = 1;
    local_84 = 1;
  }
  pybind11::function::~function(&local_38);
LAB_00726f9d:
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool convert) {
        if (src.is_none()) {
            // Defer accepting None to other overloads (if we aren't in convert mode):
            if (!convert) return false;
            return true;
        }

        if (!isinstance<function>(src))
            return false;

        auto func = reinterpret_borrow<function>(src);

        /*
           When passing a C++ function as an argument to another C++
           function via Python, every function call would normally involve
           a full C++ -> Python -> C++ roundtrip, which can be prohibitive.
           Here, we try to at least detect the case where the function is
           stateless (i.e. function pointer or lambda function without
           captured variables), in which case the roundtrip can be avoided.
         */
        if (auto cfunc = func.cpp_function()) {
            auto cfunc_self = PyCFunction_GET_SELF(cfunc.ptr());
            if (isinstance<capsule>(cfunc_self)) {
                auto c = reinterpret_borrow<capsule>(cfunc_self);
                auto rec = (function_record *) c;

                while (rec != nullptr) {
                    if (rec->is_stateless
                        && same_type(typeid(function_type),
                                     *reinterpret_cast<const std::type_info *>(rec->data[1]))) {
                        struct capture {
                            function_type f;
                        };
                        value = ((capture *) &rec->data)->f;
                        return true;
                    }
                    rec = rec->next;
                }
            }
            // PYPY segfaults here when passing builtin function like sum.
            // Raising an fail exception here works to prevent the segfault, but only on gcc.
            // See PR #1413 for full details
        }

        // ensure GIL is held during functor destruction
        struct func_handle {
            function f;
#if !(defined(_MSC_VER) && _MSC_VER == 1916 && defined(PYBIND11_CPP17) && PY_MAJOR_VERSION < 3)
            // This triggers a syntax error under very special conditions (very weird indeed).
            explicit
#endif
            func_handle(function &&f_) noexcept : f(std::move(f_)) {}
            func_handle(const func_handle &f_) { operator=(f_); }
            func_handle &operator=(const func_handle &f_) {
                gil_scoped_acquire acq;
                f = f_.f;
                return *this;
            }
            ~func_handle() {
                gil_scoped_acquire acq;
                function kill_f(std::move(f));
            }
        };

        // to emulate 'move initialization capture' in C++11
        struct func_wrapper {
            func_handle hfunc;
            explicit func_wrapper(func_handle &&hf) noexcept : hfunc(std::move(hf)) {}
            Return operator()(Args... args) const {
                gil_scoped_acquire acq;
                object retval(hfunc.f(std::forward<Args>(args)...));
                /* Visual studio 2015 parser issue: need parentheses around this expression */
                return (retval.template cast<Return>());
            }
        };

        value = func_wrapper(func_handle(std::move(func)));
        return true;
    }